

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O0

void av1_set_quantizer(AV1_COMMON *cm,int min_qmlevel,int max_qmlevel,int q,int enable_chroma_deltaq
                      ,int enable_hdr_deltaq,_Bool is_allintra,aom_tune_metric tuning)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  int *piVar4;
  int in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  byte in_stack_00000008;
  _func_int_int_int_int *get_chroma_qmlevel;
  _func_int_int_int_int *get_luma_qmlevel;
  int dqpCr;
  int dqpCb;
  int chroma_ac_delta_q;
  int chroma_dc_delta_q;
  CommonQuantParams *quant_params;
  int local_4c;
  code *local_48;
  code *local_40;
  int local_30;
  int local_2c;
  
  piVar4 = (int *)(in_RDI + 0x268);
  local_4c = in_ECX;
  if (in_ECX < *(int *)(in_RDI + 0x5f50)) {
    local_4c = *(int *)(in_RDI + 0x5f50);
  }
  *piVar4 = local_4c;
  *(undefined4 *)(in_RDI + 0x270) = 0;
  if (in_R8D == 0) {
    *(undefined4 *)(in_RDI + 0x274) = 0;
    *(undefined4 *)(in_RDI + 0x27c) = 0;
    *(undefined4 *)(in_RDI + 0x278) = 0;
    *(undefined4 *)(in_RDI + 0x280) = 0;
  }
  else if (((in_stack_00000008 & 1) == 0) ||
          (((int)get_chroma_qmlevel != 10 && ((int)get_chroma_qmlevel != 0xb)))) {
    *(undefined4 *)(in_RDI + 0x274) = 2;
    *(undefined4 *)(in_RDI + 0x27c) = 2;
    *(undefined4 *)(in_RDI + 0x278) = 2;
    *(undefined4 *)(in_RDI + 0x280) = 2;
  }
  else {
    local_30 = 0;
    if ((*(int *)(*(long *)(in_RDI + 0x6088) + 0x60) == 1) &&
       (*(int *)(*(long *)(in_RDI + 0x6088) + 100) == 1)) {
      local_30 = clamp(*piVar4 / 2 + -0xe,0,0x10);
      local_30 = -local_30;
      local_2c = local_30;
    }
    else {
      if ((*(int *)(*(long *)(in_RDI + 0x6088) + 0x60) == 1) &&
         (*(int *)(*(long *)(in_RDI + 0x6088) + 100) == 0)) {
        local_30 = clamp(*piVar4 / 2,0,6);
      }
      else if ((*(int *)(*(long *)(in_RDI + 0x6088) + 0x60) == 0) &&
              (*(int *)(*(long *)(in_RDI + 0x6088) + 100) == 0)) {
        local_30 = clamp(*piVar4 / 2,0,0x18);
      }
      local_2c = 0;
    }
    *(int *)(in_RDI + 0x274) = local_2c;
    *(int *)(in_RDI + 0x27c) = local_30;
    *(int *)(in_RDI + 0x278) = local_2c;
    *(int *)(in_RDI + 0x280) = local_30;
  }
  if (in_R9D != 0) {
    iVar1 = adjust_hdr_cb_deltaq(*piVar4);
    iVar2 = adjust_hdr_cr_deltaq(*piVar4);
    *(int *)(in_RDI + 0x27c) = iVar1;
    *(int *)(in_RDI + 0x274) = iVar1;
    *(int *)(in_RDI + 0x280) = iVar2;
    *(int *)(in_RDI + 0x278) = iVar2;
    if (iVar1 != iVar2) {
      *(undefined1 *)(*(long *)(in_RDI + 0x6088) + 0x6c) = 1;
    }
  }
  if ((in_stack_00000008 & 1) == 0) {
    local_40 = aom_get_qmlevel;
    local_48 = aom_get_qmlevel;
  }
  else if (((int)get_chroma_qmlevel == 10) || ((int)get_chroma_qmlevel == 0xb)) {
    if ((int)get_chroma_qmlevel == 0xb) {
      local_40 = aom_get_qmlevel_luma_ssimulacra2;
    }
    else {
      local_40 = aom_get_qmlevel_allintra;
    }
    if ((*(int *)(*(long *)(in_RDI + 0x6088) + 0x60) == 0) &&
       (*(int *)(*(long *)(in_RDI + 0x6088) + 100) == 0)) {
      local_48 = aom_get_qmlevel_444_chroma;
    }
    else {
      local_48 = aom_get_qmlevel_allintra;
    }
  }
  else {
    local_40 = aom_get_qmlevel_allintra;
    local_48 = aom_get_qmlevel_allintra;
  }
  uVar3 = (*local_40)(*piVar4,in_ESI,in_EDX);
  *(undefined4 *)(in_RDI + 0x4a2c) = uVar3;
  uVar3 = (*local_48)(*piVar4 + *(int *)(in_RDI + 0x27c),in_ESI,in_EDX);
  *(undefined4 *)(in_RDI + 0x4a30) = uVar3;
  if (*(char *)(*(long *)(in_RDI + 0x6088) + 0x6c) == '\0') {
    *(undefined4 *)(in_RDI + 0x4a34) = *(undefined4 *)(in_RDI + 0x4a30);
  }
  else {
    uVar3 = (*local_48)(*piVar4 + *(int *)(in_RDI + 0x280),in_ESI,in_EDX);
    *(undefined4 *)(in_RDI + 0x4a34) = uVar3;
  }
  return;
}

Assistant:

void av1_set_quantizer(AV1_COMMON *const cm, int min_qmlevel, int max_qmlevel,
                       int q, int enable_chroma_deltaq, int enable_hdr_deltaq,
                       bool is_allintra, aom_tune_metric tuning) {
  // quantizer has to be reinitialized with av1_init_quantizer() if any
  // delta_q changes.
  CommonQuantParams *quant_params = &cm->quant_params;
  quant_params->base_qindex = AOMMAX(cm->delta_q_info.delta_q_present_flag, q);
  quant_params->y_dc_delta_q = 0;

  if (enable_chroma_deltaq) {
    if (is_allintra &&
        (tuning == AOM_TUNE_IQ || tuning == AOM_TUNE_SSIMULACRA2)) {
      int chroma_dc_delta_q = 0;
      int chroma_ac_delta_q = 0;

      if (cm->seq_params->subsampling_x == 1 &&
          cm->seq_params->subsampling_y == 1) {
        // 4:2:0 subsampling: Constant chroma delta_q decrease (i.e. improved
        // chroma quality relative to luma) with gradual ramp-down for very low
        // qindexes.
        // Lowering chroma delta_q by 16 was found to improve SSIMULACRA 2
        // BD-Rate by 1.5-2% on Daala's subset1, as well as reducing chroma
        // artifacts (smudging, discoloration) during subjective quality
        // evaluations.
        // The ramp-down of chroma increase was determined by generating the
        // convex hull of SSIMULACRA 2 scores (for all boosts from 0-16), and
        // finding a linear equation that fits the convex hull.
        chroma_dc_delta_q = -clamp((quant_params->base_qindex / 2) - 14, 0, 16);
        chroma_ac_delta_q = chroma_dc_delta_q;
      } else if (cm->seq_params->subsampling_x == 1 &&
                 cm->seq_params->subsampling_y == 0) {
        // 4:2:2 subsampling: Constant chroma AC delta_q increase (i.e. improved
        // luma quality relative to chroma) with gradual ramp-down for very low
        // qindexes.
        // SSIMULACRA 2 appears to have some issues correctly scoring 4:2:2
        // material. Solely optimizing for maximum scores suggests a chroma AC
        // delta_q of 12 is the most efficient. However, visual inspection on
        // difficult-to-encode material resulted in chroma quality degrading too
        // much relative to luma, and chroma channels ending up being too small
        // compared to equivalent 4:4:4 or 4:2:0 encodes.
        // A chroma AC delta_q of 6 was selected because encoded chroma channels
        // have a much closer size to 4:4:4 and 4:2:0 encodes, and have more
        // favorable visual quality characteristics.
        // The ramp-down of chroma decrease was put into place to match 4:2:0
        // and 4:4:4 behavior. There were no special considerations on
        // SSIMULACRA 2 scores.
        chroma_dc_delta_q = 0;
        chroma_ac_delta_q = clamp((quant_params->base_qindex / 2), 0, 6);
      } else if (cm->seq_params->subsampling_x == 0 &&
                 cm->seq_params->subsampling_y == 0) {
        // 4:4:4 subsampling: Constant chroma AC delta_q increase (i.e. improved
        // luma quality relative to chroma) with gradual ramp-down for very low
        // qindexes.
        // Raising chroma AC delta_q by 24 was found to improve SSIMULACRA 2
        // BD-Rate by 2.5-3% on Daala's subset1, as well as providing a more
        // balanced bit allocation between the (relatively-starved) luma and
        // chroma channels.
        // Raising chroma DC delta_q appears to be harmful, both for SSIMULACRA
        // 2 scores and subjective quality (harshens blocking artifacts).
        // The ramp-down of chroma decrease was put into place so (lossy) QP 0
        // encodes still score within 0.1 SSIMULACRA 2 points of the equivalent
        // with no chroma delta_q (with a small efficiency improvement), while
        // encodes in the SSIMULACRA 2 <=90 range yield full benefits from this
        // adjustment.
        chroma_dc_delta_q = 0;
        chroma_ac_delta_q = clamp((quant_params->base_qindex / 2), 0, 24);
      }

      // TODO: bug https://crbug.com/aomedia/375221136 - find chroma_delta_q
      // values for 4:2:2 subsampling mode.
      quant_params->u_dc_delta_q = chroma_dc_delta_q;
      quant_params->u_ac_delta_q = chroma_ac_delta_q;
      quant_params->v_dc_delta_q = chroma_dc_delta_q;
      quant_params->v_ac_delta_q = chroma_ac_delta_q;
    } else {
      // TODO(aomedia:2717): need to design better delta
      quant_params->u_dc_delta_q = 2;
      quant_params->u_ac_delta_q = 2;
      quant_params->v_dc_delta_q = 2;
      quant_params->v_ac_delta_q = 2;
    }
  } else {
    quant_params->u_dc_delta_q = 0;
    quant_params->u_ac_delta_q = 0;
    quant_params->v_dc_delta_q = 0;
    quant_params->v_ac_delta_q = 0;
  }

  // following section 8.3.2 in T-REC-H.Sup15 document
  // to apply to AV1 qindex in the range of [0, 255]
  if (enable_hdr_deltaq) {
    int dqpCb = adjust_hdr_cb_deltaq(quant_params->base_qindex);
    int dqpCr = adjust_hdr_cr_deltaq(quant_params->base_qindex);
    quant_params->u_dc_delta_q = quant_params->u_ac_delta_q = dqpCb;
    quant_params->v_dc_delta_q = quant_params->v_ac_delta_q = dqpCr;
    if (dqpCb != dqpCr) {
      cm->seq_params->separate_uv_delta_q = 1;
    }
  }

  // Select the best luma and chroma QM formulas based on encoding mode and
  // tuning
  int (*get_luma_qmlevel)(int, int, int);
  int (*get_chroma_qmlevel)(int, int, int);

  if (is_allintra) {
    if (tuning == AOM_TUNE_IQ || tuning == AOM_TUNE_SSIMULACRA2) {
      if (tuning == AOM_TUNE_SSIMULACRA2) {
        // Use luma QM formula specifically tailored for tune SSIMULACRA2
        get_luma_qmlevel = aom_get_qmlevel_luma_ssimulacra2;
      } else {
        get_luma_qmlevel = aom_get_qmlevel_allintra;
      }

      if (cm->seq_params->subsampling_x == 0 &&
          cm->seq_params->subsampling_y == 0) {
        // 4:4:4 subsampling mode has 4x the number of chroma coefficients
        // compared to 4:2:0 (2x on each dimension). This means the encoder
        // should use lower chroma QM levels that more closely match the scaling
        // of an equivalent 4:2:0 chroma QM.
        get_chroma_qmlevel = aom_get_qmlevel_444_chroma;
      } else {
        // For all other chroma subsampling modes, use the all intra QM formula
        get_chroma_qmlevel = aom_get_qmlevel_allintra;
      }
    } else {
      get_luma_qmlevel = aom_get_qmlevel_allintra;
      get_chroma_qmlevel = aom_get_qmlevel_allintra;
    }
  } else {
    get_luma_qmlevel = aom_get_qmlevel;
    get_chroma_qmlevel = aom_get_qmlevel;
  }

  quant_params->qmatrix_level_y =
      get_luma_qmlevel(quant_params->base_qindex, min_qmlevel, max_qmlevel);
  quant_params->qmatrix_level_u =
      get_chroma_qmlevel(quant_params->base_qindex + quant_params->u_ac_delta_q,
                         min_qmlevel, max_qmlevel);

  if (cm->seq_params->separate_uv_delta_q) {
    quant_params->qmatrix_level_v = get_chroma_qmlevel(
        quant_params->base_qindex + quant_params->v_ac_delta_q, min_qmlevel,
        max_qmlevel);
  } else {
    quant_params->qmatrix_level_v = quant_params->qmatrix_level_u;
  }
}